

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::fill(void *src,void *dst,int dstride,int ures,int vres,int pixelsize)

{
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  char *end;
  char *ptr;
  int rowlen;
  undefined8 local_30;
  
  for (local_30 = in_RSI; local_30 != (void *)((long)in_RSI + (long)(in_ECX * in_R9D));
      local_30 = (void *)((long)local_30 + (long)in_R9D)) {
    memcpy(local_30,in_RDI,(long)in_R9D);
  }
  for (local_30 = (void *)((long)in_RSI + (long)in_EDX);
      local_30 != (void *)((long)in_RSI + (long)(in_R8D * in_EDX));
      local_30 = (void *)((long)local_30 + (long)in_EDX)) {
    memcpy(local_30,in_RSI,(long)(in_ECX * in_R9D));
  }
  return;
}

Assistant:

void fill(const void* src, void* dst, int dstride,
          int ures, int vres, int pixelsize)
{
    // fill first row
    int rowlen = ures*pixelsize;
    char* ptr = (char*) dst;
    char* end = ptr + rowlen;
    for (; ptr != end; ptr += pixelsize) memcpy(ptr, src, pixelsize);

    // fill remaining rows from first row
    ptr = (char*) dst + dstride;
    end = (char*) dst + vres*dstride;
    for (; ptr != end; ptr += dstride) memcpy(ptr, dst, rowlen);
}